

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O1

lyxml_attr * lyxml_dup_attr(ly_ctx *ctx,lyxml_elem *parent,lyxml_attr *attr)

{
  LYXML_ATTR_TYPE LVar1;
  lyxml_attr *plVar2;
  lyxml_attr *attr_00;
  char *pcVar3;
  lyxml_attr *plVar4;
  
  if (parent == (lyxml_elem *)0x0 || attr == (lyxml_attr *)0x0) {
    attr_00 = (lyxml_attr *)0x0;
  }
  else {
    attr_00 = (lyxml_attr *)calloc(1,0x28);
    if (attr_00 == (lyxml_attr *)0x0) {
      attr_00 = (lyxml_attr *)0x0;
      ly_log(ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyxml_dup_attr");
    }
    else {
      pcVar3 = lydict_insert(ctx,attr->value,0);
      attr_00->value = pcVar3;
      pcVar3 = lydict_insert(ctx,attr->name,0);
      attr_00->name = pcVar3;
      LVar1 = attr->type;
      attr_00->type = LVar1;
      if ((LVar1 == LYXML_ATTR_STD) && (attr->ns != (lyxml_ns *)0x0)) {
        attr_00->ns = attr->ns;
        lyxml_correct_attr_ns(ctx,attr_00,parent,1);
      }
      if (attr_00->type == LYXML_ATTR_NS) {
        attr_00->ns = (lyxml_ns *)parent;
      }
      plVar2 = parent->attr;
      if (parent->attr == (lyxml_attr *)0x0) {
        parent->attr = attr_00;
      }
      else {
        do {
          plVar4 = plVar2;
          plVar2 = plVar4->next;
        } while (plVar2 != (lyxml_attr *)0x0);
        plVar4->next = attr_00;
      }
    }
  }
  return attr_00;
}

Assistant:

static struct lyxml_attr *
lyxml_dup_attr(struct ly_ctx *ctx, struct lyxml_elem *parent, struct lyxml_attr *attr)
{
    struct lyxml_attr *result, *a;

    if (!attr || !parent) {
        return NULL;
    }

    if (attr->type == LYXML_ATTR_NS) {
        /* this is correct, despite that all attributes seems like a standard
         * attributes (struct lyxml_attr), some of them can be namespace
         * definitions (and in that case they are struct lyxml_ns).
         */
        result = (struct lyxml_attr *)calloc(1, sizeof (struct lyxml_ns));
    } else {
        result = calloc(1, sizeof (struct lyxml_attr));
    }
    LY_CHECK_ERR_RETURN(!result, LOGMEM(ctx), NULL);

    result->value = lydict_insert(ctx, attr->value, 0);
    result->name = lydict_insert(ctx, attr->name, 0);
    result->type = attr->type;

    /* set namespace in case of standard attributes */
    if (result->type == LYXML_ATTR_STD && attr->ns) {
        result->ns = attr->ns;
        lyxml_correct_attr_ns(ctx, result, parent, 1);
    }

    /* set parent pointer in case of namespace attribute */
    if (result->type == LYXML_ATTR_NS) {
        ((struct lyxml_ns *)result)->parent = parent;
    }

    /* put attribute into the parent's attributes list */
    if (parent->attr) {
        /* go to the end of the list */
        for (a = parent->attr; a->next; a = a->next);
        /* and append new attribute */
        a->next = result;
    } else {
        /* add the first attribute in the list */
        parent->attr = result;
    }

    return result;
}